

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmEmulator.cpp
# Opt level: O3

int main(void)

{
  pointer pcVar1;
  char cVar2;
  byte bVar3;
  uint16_t uVar4;
  int iVar5;
  uint32_t uVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  RAM *this;
  GEN_Register *pGVar10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar11;
  int i;
  long lVar12;
  int j;
  long lVar13;
  _Alloc_hider _Var14;
  long lVar15;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  splitCommand;
  string cmdHolder;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_438;
  GEN_Register *local_420;
  SFLAG_Register *local_418;
  string local_410;
  string local_3f0;
  string local_3d0;
  string local_3b0;
  string local_390;
  string local_370;
  string local_350;
  string local_330;
  string local_310;
  string local_2f0;
  string local_2d0;
  string local_2b0;
  string local_290;
  string local_270;
  string local_250;
  string local_230;
  string local_210;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"AsmEmulator v0.1",0x10);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x50);
  std::ostream::put(-0x50);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Initializing RAMDISK.",0x15);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x50);
  std::ostream::put(-0x50);
  std::ostream::flush();
  this = (RAM *)operator_new(1);
  RAM::RAM(this);
  pGVar10 = (GEN_Register *)operator_new(1);
  GEN_Register::GEN_Register(pGVar10);
  local_420 = pGVar10;
  local_418 = (SFLAG_Register *)operator_new(0x20);
  SFLAG_Register::SFLAG_Register(local_418);
  local_3f0._M_dataplus._M_p = (pointer)&local_3f0.field_2;
  local_3f0._M_string_length = 0;
  local_3f0.field_2._M_local_buf[0] = '\0';
  do {
    std::__cxx11::string::_M_replace
              ((ulong)&local_3f0,0,(char *)local_3f0._M_string_length,0x10812d);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"> ",2);
    do {
      cVar2 = std::ios::widen((char)*(undefined8 *)(std::cin + -0x18) + '\b');
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)&std::cin,(string *)&local_3f0,cVar2);
      iVar5 = std::__cxx11::string::compare((char *)&local_3f0);
    } while (iVar5 == 0);
    StringHelpers::split(&local_438,&local_3f0,' ');
    iVar5 = std::__cxx11::string::compare
                      ((char *)local_438.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start);
    if (iVar5 == 0) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_438);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3f0._M_dataplus._M_p != &local_3f0.field_2) {
        operator_delete(local_3f0._M_dataplus._M_p,
                        CONCAT71(local_3f0.field_2._M_allocated_capacity._1_7_,
                                 local_3f0.field_2._M_local_buf[0]) + 1);
      }
      return 0;
    }
    iVar5 = std::__cxx11::string::compare
                      ((char *)local_438.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start);
    if (iVar5 == 0) {
      lVar15 = 0;
      lVar12 = 0;
      do {
        lVar13 = 0;
        do {
          bVar3 = RAM::read8Bits(this,lVar15 + lVar13);
          printf("%X ",(ulong)bVar3);
          lVar13 = lVar13 + 1;
        } while (lVar13 != 0x32);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x50);
        std::ostream::put(-0x50);
        std::ostream::flush();
        lVar12 = lVar12 + 1;
        lVar15 = lVar15 + 0x14;
      } while (lVar12 != 0x14);
      goto LAB_00104295;
    }
    iVar5 = std::__cxx11::string::compare
                      ((char *)local_438.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start);
    if (iVar5 == 0) {
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"AL","");
      pGVar10 = local_420;
      bVar3 = GEN_Register::getReg_8(local_420,&local_70);
      printf("AL: %X\n",(ulong)bVar3);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"AH","");
      bVar3 = GEN_Register::getReg_8(pGVar10,&local_90);
      printf("AH: %X\n",(ulong)bVar3);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"AX","");
      uVar4 = GEN_Register::getReg_16(pGVar10,&local_b0);
      printf("AX: %X\n",(ulong)uVar4);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
      }
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"EAX","");
      uVar6 = GEN_Register::getReg_32(pGVar10,&local_d0);
      printf("EAX: %X\n",(ulong)uVar6);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
      }
      local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"DL","");
      bVar3 = GEN_Register::getReg_8(pGVar10,&local_f0);
      printf("DL: %X\n",(ulong)bVar3);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
        operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
      }
      local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"DH","");
      bVar3 = GEN_Register::getReg_8(pGVar10,&local_110);
      printf("DH: %X\n",(ulong)bVar3);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_110._M_dataplus._M_p != &local_110.field_2) {
        operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
      }
      local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"DX","");
      uVar4 = GEN_Register::getReg_16(pGVar10,&local_130);
      printf("DX: %X\n",(ulong)uVar4);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_130._M_dataplus._M_p != &local_130.field_2) {
        operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
      }
      local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"EDX","");
      uVar6 = GEN_Register::getReg_32(pGVar10,&local_150);
      printf("EDX: %X\n",(ulong)uVar6);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_150._M_dataplus._M_p != &local_150.field_2) {
        operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
      }
      local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_170,"CL","");
      bVar3 = GEN_Register::getReg_8(pGVar10,&local_170);
      printf("CL: %X\n",(ulong)bVar3);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_170._M_dataplus._M_p != &local_170.field_2) {
        operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
      }
      local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_190,"CH","");
      bVar3 = GEN_Register::getReg_8(pGVar10,&local_190);
      printf("CH: %X\n",(ulong)bVar3);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_190._M_dataplus._M_p != &local_190.field_2) {
        operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
      }
      local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b0,"CX","");
      uVar4 = GEN_Register::getReg_16(pGVar10,&local_1b0);
      printf("CX: %X\n",(ulong)uVar4);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
        operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
      }
      local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d0,"ECX","");
      uVar6 = GEN_Register::getReg_32(pGVar10,&local_1d0);
      printf("ECX: %X\n",(ulong)uVar6);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
        operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
      }
      local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f0,"BL","");
      bVar3 = GEN_Register::getReg_8(pGVar10,&local_1f0);
      printf("BL: %X\n",(ulong)bVar3);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
        operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
      }
      local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_210,"BH","");
      bVar3 = GEN_Register::getReg_8(pGVar10,&local_210);
      printf("BH: %X\n",(ulong)bVar3);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_210._M_dataplus._M_p != &local_210.field_2) {
        operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
      }
      local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,"BX","");
      uVar4 = GEN_Register::getReg_16(pGVar10,&local_230);
      printf("BX: %X\n",(ulong)uVar4);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_230._M_dataplus._M_p != &local_230.field_2) {
        operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
      }
      local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_250,"EBX","");
      uVar6 = GEN_Register::getReg_32(pGVar10,&local_250);
      printf("EBX: %X\n",(ulong)uVar6);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_250._M_dataplus._M_p != &local_250.field_2) {
        operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
      }
      local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_270,"BP","");
      uVar4 = GEN_Register::getReg_16(pGVar10,&local_270);
      printf("BP: %X\n",(ulong)uVar4);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_270._M_dataplus._M_p != &local_270.field_2) {
        operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
      }
      local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_290,"EBP","");
      uVar6 = GEN_Register::getReg_32(pGVar10,&local_290);
      printf("EBP: %X\n",(ulong)uVar6);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_290._M_dataplus._M_p != &local_290.field_2) {
        operator_delete(local_290._M_dataplus._M_p,local_290.field_2._M_allocated_capacity + 1);
      }
      local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b0,"SI","");
      uVar4 = GEN_Register::getReg_16(pGVar10,&local_2b0);
      printf("SI: %X\n",(ulong)uVar4);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
        operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
      }
      local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d0,"ESI","");
      uVar6 = GEN_Register::getReg_32(pGVar10,&local_2d0);
      printf("ESI: %X\n",(ulong)uVar6);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
        operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1);
      }
      local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f0,"DI","");
      uVar4 = GEN_Register::getReg_16(pGVar10,&local_2f0);
      printf("DI: %X\n",(ulong)uVar4);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
        operator_delete(local_2f0._M_dataplus._M_p,local_2f0.field_2._M_allocated_capacity + 1);
      }
      local_310._M_dataplus._M_p = (pointer)&local_310.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_310,"EDI","");
      uVar6 = GEN_Register::getReg_32(pGVar10,&local_310);
      printf("EDI: %X\n",(ulong)uVar6);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_310._M_dataplus._M_p != &local_310.field_2) {
        operator_delete(local_310._M_dataplus._M_p,local_310.field_2._M_allocated_capacity + 1);
      }
      local_330._M_dataplus._M_p = (pointer)&local_330.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_330,"SP","");
      uVar4 = GEN_Register::getReg_16(pGVar10,&local_330);
      printf("SP: %X\n",(ulong)uVar4);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_330._M_dataplus._M_p != &local_330.field_2) {
        operator_delete(local_330._M_dataplus._M_p,local_330.field_2._M_allocated_capacity + 1);
      }
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"ESP","");
      GEN_Register::getReg_32(pGVar10,&local_50);
      printf("ESP: %X\n");
      paVar11 = &local_50.field_2;
      _Var14._M_p = local_50._M_dataplus._M_p;
LAB_00104282:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Var14._M_p != paVar11) {
        operator_delete(_Var14._M_p,paVar11->_M_allocated_capacity + 1);
      }
    }
    else {
      iVar5 = std::__cxx11::string::compare
                        ((char *)local_438.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start);
      pGVar10 = local_420;
      if (iVar5 == 0) {
        iVar5 = std::__cxx11::string::compare
                          ((char *)(local_438.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start + 1));
        if (iVar5 == 0) {
          local_350._M_dataplus._M_p = (pointer)&local_350.field_2;
          pcVar1 = local_438.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[2]._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_350,pcVar1,
                     pcVar1 + local_438.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[2]._M_string_length);
          local_370._M_dataplus._M_p = (pointer)&local_370.field_2;
          pcVar1 = local_438.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[3]._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_370,pcVar1,
                     pcVar1 + local_438.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[3]._M_string_length);
          iVar5 = StringHelpers::stringToNumber(&local_370);
          GEN_Register::setReg_8(local_420,&local_350,(uint8_t)iVar5);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_370._M_dataplus._M_p != &local_370.field_2) {
            operator_delete(local_370._M_dataplus._M_p,local_370.field_2._M_allocated_capacity + 1);
          }
          paVar11 = &local_350.field_2;
          _Var14._M_p = local_350._M_dataplus._M_p;
          goto LAB_00104282;
        }
      }
      else {
        iVar5 = std::__cxx11::string::compare
                          ((char *)local_438.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start);
        if (iVar5 == 0) {
          local_410._M_dataplus._M_p = (pointer)&local_410.field_2;
          pcVar1 = local_438.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_410,pcVar1,
                     pcVar1 + local_438.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[1]._M_string_length);
          iVar5 = StringHelpers::stringToNumber(&local_410);
          local_390._M_dataplus._M_p = (pointer)&local_390.field_2;
          pcVar1 = local_438.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[2]._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_390,pcVar1,
                     pcVar1 + local_438.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[2]._M_string_length);
          iVar7 = StringHelpers::stringToNumber(&local_390);
          RAM::read32Bits(this,(long)iVar5,(uint8_t)iVar7);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_390._M_dataplus._M_p != &local_390.field_2) {
            operator_delete(local_390._M_dataplus._M_p,local_390.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_410._M_dataplus._M_p != &local_410.field_2) {
            operator_delete(local_410._M_dataplus._M_p,local_410.field_2._M_allocated_capacity + 1);
          }
          local_3b0._M_dataplus._M_p = (pointer)&local_3b0.field_2;
          pcVar1 = local_438.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[2]._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_3b0,pcVar1,
                     pcVar1 + local_438.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[2]._M_string_length);
          uVar8 = StringHelpers::stringToNumber(&local_3b0);
          local_3d0._M_dataplus._M_p = (pointer)&local_3d0.field_2;
          pcVar1 = local_438.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_3d0,pcVar1,
                     pcVar1 + local_438.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[1]._M_string_length);
          uVar9 = StringHelpers::stringToNumber(&local_3d0);
          printf("Wrote value 0x%X to memory location 0x%X.\n",(ulong)uVar8,(ulong)uVar9);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3d0._M_dataplus._M_p != &local_3d0.field_2) {
            operator_delete(local_3d0._M_dataplus._M_p,local_3d0.field_2._M_allocated_capacity + 1);
          }
          paVar11 = &local_3b0.field_2;
          _Var14._M_p = local_3b0._M_dataplus._M_p;
          goto LAB_00104282;
        }
        Opcodes::run(local_418,pGVar10,this,&local_438);
      }
    }
LAB_00104295:
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_438);
  } while( true );
}

Assistant:

int main() {
    // Show startup statements.
    std::cout << "AsmEmulator v0.1" << std::endl;
    // Load in a new RAMDISK.
    std::cout << "Initializing RAMDISK." << std::endl;
    RAM *ram = new RAM();
    GEN_Register *gen = new GEN_Register();
    SFLAG_Register *sflag = new SFLAG_Register();
    //////////////////////////////////////////////////////
    // Temporary testing code - remove in final release //
    // Holder for command input.
    std::string cmdHolder;
    // Console input loop.
    while (true) {
        // Reset to an empty value.
        cmdHolder = "";
        // Get input.
        std::cout << "> ";
        while (true) {
            std::getline(std::cin, cmdHolder);
            // If we get an enter key bounce, loop back.
            if (cmdHolder == "") {
                continue;
            } else {
                break;
            }
        }
        // Split up the command into arguments.
        std::vector<std::string> splitCommand = StringHelpers::split(cmdHolder, ' ');
        // Check for exit condition.
        if (splitCommand[0] == "exit") {
            break;
        }
            // Dump the first 1000 bytes of memory.
        else if (splitCommand[0] == "dumpmem") {
            for (int i = 0; i < 20; i++) {
                for (int j = 0; j < 50; j++) {
                    printf("%X ", ram->read8Bits((i * 20) + j));
                }
                std::cout << std::endl;
            }
        }
            // Dump all values in the registry.
        else if (splitCommand[0] == "dumpgenregs") {
            printf("AL: %X\n", gen->getReg_8("AL"));
            printf("AH: %X\n", gen->getReg_8("AH"));
            printf("AX: %X\n", gen->getReg_16("AX"));
            printf("EAX: %X\n", gen->getReg_32("EAX"));

            printf("DL: %X\n", gen->getReg_8("DL"));
            printf("DH: %X\n", gen->getReg_8("DH"));
            printf("DX: %X\n", gen->getReg_16("DX"));
            printf("EDX: %X\n", gen->getReg_32("EDX"));

            printf("CL: %X\n", gen->getReg_8("CL"));
            printf("CH: %X\n", gen->getReg_8("CH"));
            printf("CX: %X\n", gen->getReg_16("CX"));
            printf("ECX: %X\n", gen->getReg_32("ECX"));

            printf("BL: %X\n", gen->getReg_8("BL"));
            printf("BH: %X\n", gen->getReg_8("BH"));
            printf("BX: %X\n", gen->getReg_16("BX"));
            printf("EBX: %X\n", gen->getReg_32("EBX"));

            printf("BP: %X\n", gen->getReg_16("BP"));
            printf("EBP: %X\n", gen->getReg_32("EBP"));

            printf("SI: %X\n", gen->getReg_16("SI"));
            printf("ESI: %X\n", gen->getReg_32("ESI"));

            printf("DI: %X\n", gen->getReg_16("DI"));
            printf("EDI: %X\n", gen->getReg_32("EDI"));

            printf("SP: %X\n", gen->getReg_16("SP"));
            printf("ESP: %X\n", gen->getReg_32("ESP"));
        } else if (splitCommand[0] == "setgenreg") {
            if (splitCommand[1] == "8") {
                gen->setReg_8(splitCommand[2], StringHelpers::stringToNumber(splitCommand[3]));
            }
        }
            // Write an 8-bit value to memory.
        else if (splitCommand[0] == "writemem-8i") {
            ram->write8Bits(StringHelpers::stringToNumber(splitCommand[1]),
                            StringHelpers::stringToNumber(splitCommand[2]));
            printf("Wrote value 0x%X to memory location 0x%X.\n", StringHelpers::stringToNumber(splitCommand[2]),
                   StringHelpers::stringToNumber(splitCommand[1]));
        }
            // Treat command as an opcode.
        else {
            Opcodes::run(*sflag, *gen, *ram, splitCommand);
        }
    }
    //////////////////////////////////////////////////////
    return 0;
}